

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O3

void __thiscall irr::scene::SViewFrustum::recalculateBoundingSphere(SViewFrustum *this)

{
  plane3d<float> *ppVar1;
  plane3d<float> *o2;
  plane3d<float> *o2_00;
  plane3d<float> *ppVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  plane3d<float> *this_00;
  float *pfVar28;
  long lVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float diam [8];
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  plane3d<float> *local_e8;
  plane3d<float> *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [12];
  float fStack_ac;
  undefined1 local_a8 [12];
  float fStack_9c;
  vector3d<float> local_98;
  undefined8 local_8c;
  float local_84;
  undefined8 local_80;
  float local_78;
  undefined8 local_74;
  float local_6c;
  undefined8 local_68;
  float local_60;
  undefined8 local_5c;
  float local_54;
  undefined8 local_50;
  float local_48;
  undefined8 local_44;
  float local_3c;
  
  lVar29 = 0;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  ppVar2 = this->planes + 1;
  ppVar1 = this->planes + 5;
  o2 = this->planes + 2;
  local_e0 = ppVar2;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2,&local_98);
  fVar34 = local_98.Z;
  local_a8._0_4_ = local_98.X;
  local_a8._4_4_ = local_98.Y;
  stack0xffffffffffffff60 = 0;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  o2_00 = this->planes + 3;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2_00,&local_98);
  local_b8._0_4_ = local_98.X;
  local_b8._4_4_ = local_98.Y;
  stack0xffffffffffffff50 = 0;
  local_c8 = ZEXT416((uint)local_98.Z);
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  ppVar2 = this->planes;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2,&local_98);
  fVar30 = local_98.Z;
  local_d8._0_4_ = local_98.X;
  local_d8._4_4_ = local_98.Y;
  local_d8._8_8_ = 0;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2_00,&local_98);
  fVar32 = (float)local_d8._0_4_ - local_98.X;
  fVar33 = (float)local_d8._4_4_ - local_98.Y;
  fVar35 = (float)local_d8._4_4_ - local_98.Y;
  auVar31._0_4_ =
       (fVar34 - (float)local_c8._0_4_) * (fVar34 - (float)local_c8._0_4_) +
       ((float)local_a8._0_4_ - (float)local_b8._0_4_) *
       ((float)local_a8._0_4_ - (float)local_b8._0_4_) +
       ((float)local_a8._4_4_ - (float)local_b8._4_4_) *
       ((float)local_a8._4_4_ - (float)local_b8._4_4_);
  auVar31._4_4_ = (fVar30 - local_98.Z) * (fVar30 - local_98.Z) + fVar32 * fVar32 + fVar35 * fVar35;
  auVar31._8_4_ =
       (0.0 - (float)local_c8._4_4_) * (0.0 - (float)local_c8._4_4_) +
       ((float)local_a8._4_4_ - (float)local_b8._4_4_) *
       ((float)local_a8._4_4_ - (float)local_b8._4_4_) +
       ((float)local_a8._8_4_ - (float)local_b8._8_4_) *
       ((float)local_a8._8_4_ - (float)local_b8._8_4_);
  auVar31._12_4_ = fVar33 * fVar33 + (fStack_9c - fStack_ac) * (fStack_9c - fStack_ac) + 0.0;
  auVar31 = sqrtps(auVar31,auVar31);
  fVar34 = this->FarNearDistance;
  fVar34 = (((auVar31._4_4_ + auVar31._0_4_) * (auVar31._0_4_ - auVar31._4_4_)) / (fVar34 * 4.0) +
           fVar34) * -0.5 + fVar34;
  uVar8 = this->planes[1].Normal.X;
  uVar18 = this->planes[1].Normal.Y;
  uVar9 = (this->cameraPosition).X;
  uVar19 = (this->cameraPosition).Y;
  fVar30 = (this->cameraPosition).Z;
  fVar32 = this->planes[1].Normal.Z;
  (this->BoundingCenter).X = (float)uVar9 - fVar34 * (float)uVar8;
  (this->BoundingCenter).Y = (float)uVar19 - fVar34 * (float)uVar18;
  (this->BoundingCenter).Z = fVar30 - fVar34 * fVar32;
  local_98.X = 0.0;
  local_98.Y = 0.0;
  local_98.Z = 0.0;
  local_e8 = ppVar1;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2,&local_98);
  uVar10 = (this->BoundingCenter).X;
  uVar20 = (this->BoundingCenter).Y;
  fVar34 = local_98.Y;
  local_98.X = local_98.X - (float)uVar10;
  local_98.Y = fVar34 - (float)uVar20;
  local_98.Z = local_98.Z - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2_00,(vector3d<float> *)local_108);
  uVar11 = (this->BoundingCenter).X;
  uVar21 = (this->BoundingCenter).Y;
  local_8c = CONCAT44(local_108._4_4_ - (float)uVar21,local_108._0_4_ - (float)uVar11);
  local_84 = (float)uStack_100 - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  ppVar1 = this->planes + 4;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2,(vector3d<float> *)local_108);
  uVar12 = (this->BoundingCenter).X;
  uVar22 = (this->BoundingCenter).Y;
  local_80 = CONCAT44(local_108._4_4_ - (float)uVar22,local_108._0_4_ - (float)uVar12);
  local_78 = (float)uStack_100 - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(ppVar2,ppVar1,o2_00,(vector3d<float> *)local_108);
  this_00 = local_e0;
  uVar13 = (this->BoundingCenter).X;
  uVar23 = (this->BoundingCenter).Y;
  local_74 = CONCAT44(local_108._4_4_ - (float)uVar23,local_108._0_4_ - (float)uVar13);
  local_6c = (float)uStack_100 - (this->BoundingCenter).Z;
  pfVar28 = &local_6c;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes
            (local_e0,ppVar1,o2_00,(vector3d<float> *)local_108);
  uVar14 = (this->BoundingCenter).X;
  uVar24 = (this->BoundingCenter).Y;
  local_68 = CONCAT44(local_108._4_4_ - (float)uVar24,local_108._0_4_ - (float)uVar14);
  local_60 = (float)uStack_100 - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,ppVar1,o2,(vector3d<float> *)local_108);
  ppVar2 = local_e8;
  uVar15 = (this->BoundingCenter).X;
  uVar25 = (this->BoundingCenter).Y;
  local_5c = CONCAT44(local_108._4_4_ - (float)uVar25,local_108._0_4_ - (float)uVar15);
  local_54 = (float)uStack_100 - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100._0_4_ = 0.0;
  core::plane3d<float>::getIntersectionWithPlanes
            (this_00,local_e8,o2_00,(vector3d<float> *)local_108);
  uVar16 = (this->BoundingCenter).X;
  uVar26 = (this->BoundingCenter).Y;
  local_50 = CONCAT44(local_108._4_4_ - (float)uVar26,local_108._0_4_ - (float)uVar16);
  local_48 = (float)uStack_100 - (this->BoundingCenter).Z;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100 = (ulong)uStack_100._4_4_ << 0x20;
  core::plane3d<float>::getIntersectionWithPlanes(this_00,ppVar2,o2,(vector3d<float> *)local_108);
  uVar17 = (this->BoundingCenter).X;
  uVar27 = (this->BoundingCenter).Y;
  local_44 = CONCAT44(local_108._4_4_ - (float)uVar27,local_108._0_4_ - (float)uVar17);
  local_3c = (float)uStack_100 - (this->BoundingCenter).Z;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108._0_4_ = 0.0;
  local_108._4_4_ = 0.0;
  uStack_100 = 0;
  do {
    fVar34 = pfVar28[-2];
    fVar30 = pfVar28[-5];
    fVar32 = pfVar28[-8];
    fVar33 = pfVar28[-1];
    fVar35 = pfVar28[-4];
    fVar4 = pfVar28[-7];
    fVar5 = *pfVar28;
    fVar6 = pfVar28[-3];
    fVar7 = pfVar28[-6];
    lVar3 = lVar29 * 4;
    *(float *)(local_108 + lVar3) =
         pfVar28[-9] * pfVar28[-9] + pfVar28[-0xb] * pfVar28[-0xb] + pfVar28[-10] * pfVar28[-10];
    *(float *)(local_108 + lVar3 + 4) = fVar7 * fVar7 + fVar32 * fVar32 + fVar4 * fVar4;
    *(float *)((long)&uStack_100 + lVar3) = fVar6 * fVar6 + fVar30 * fVar30 + fVar35 * fVar35;
    *(float *)((long)&uStack_100 + lVar3 + 4) = fVar5 * fVar5 + fVar34 * fVar34 + fVar33 * fVar33;
    lVar29 = lVar29 + 4;
    pfVar28 = pfVar28 + 0xc;
  } while (lVar29 != 8);
  lVar29 = 0;
  fVar34 = 0.0;
  do {
    fVar30 = *(float *)(local_108 + lVar29 * 4);
    if (*(float *)(local_108 + lVar29 * 4) <= fVar34) {
      fVar30 = fVar34;
    }
    lVar29 = lVar29 + 1;
    fVar34 = fVar30;
  } while (lVar29 != 8);
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    fVar30 = SQRT(fVar30);
  }
  this->BoundingRadius = fVar30;
  return;
}

Assistant:

inline void SViewFrustum::recalculateBoundingSphere()
{
	// Find the center
	const float shortlen = (getNearLeftUp() - getNearRightUp()).getLength();
	const float longlen = (getFarLeftUp() - getFarRightUp()).getLength();

	const float farlen = FarNearDistance;
	const float fartocenter = (farlen + (shortlen - longlen) * (shortlen + longlen) / (4 * farlen)) / 2;
	const float neartocenter = farlen - fartocenter;

	BoundingCenter = cameraPosition + -planes[VF_NEAR_PLANE].Normal * neartocenter;

	// Find the radius
	core::vector3df dir[8];
	dir[0] = getFarLeftUp() - BoundingCenter;
	dir[1] = getFarRightUp() - BoundingCenter;
	dir[2] = getFarLeftDown() - BoundingCenter;
	dir[3] = getFarRightDown() - BoundingCenter;
	dir[4] = getNearRightDown() - BoundingCenter;
	dir[5] = getNearLeftDown() - BoundingCenter;
	dir[6] = getNearRightUp() - BoundingCenter;
	dir[7] = getNearLeftUp() - BoundingCenter;

	u32 i = 0;
	float diam[8] = {0.f};

	for (i = 0; i < 8; ++i)
		diam[i] = dir[i].getLengthSQ();

	float longest = 0;

	for (i = 0; i < 8; ++i) {
		if (diam[i] > longest)
			longest = diam[i];
	}

	BoundingRadius = sqrtf(longest);
}